

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

lhcell * lhFindSibeling(lhcell *pCell)

{
  lhcell *local_28;
  lhcell *pEntry;
  lhpage *pPage;
  lhcell *pCell_local;
  
  local_28 = pCell->pPage->pMaster->pFirst;
  while( true ) {
    if (local_28 == (lhcell *)0x0) {
      return (lhcell *)0x0;
    }
    if ((local_28->pPage == pCell->pPage) && (local_28->iNext == pCell->iStart)) break;
    local_28 = local_28->pPrev;
  }
  return local_28;
}

Assistant:

static lhcell * lhFindSibeling(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage->pMaster;
	lhcell *pEntry;
	pEntry = pPage->pFirst; 
	while( pEntry ){
		if( pEntry->pPage == pCell->pPage && pEntry->iNext == pCell->iStart ){
			/* Sibeling found */
			return pEntry;
		}
		/* Point to the previous entry */
		pEntry = pEntry->pPrev; 
	}
	/* Last inserted cell */
	return 0;
}